

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const*&,char_const(&)[2],kj::StringTree,kj::String&,char_const*&>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [2],
          StringTree *params_2,String *params_3,char **params_4)

{
  Branch *pBVar1;
  ArrayPtr<const_char> *params_4_00;
  ArrayPtr<const_char> AVar2;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  Branch *local_38;
  char *local_30;
  
  local_58 = toCharSequence<char_const*&>((char **)this);
  AVar2 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  params_4_00 = (ArrayPtr<const_char> *)AVar2.ptr;
  pBVar1 = (Branch *)(params_2->text).content.ptr;
  local_38 = pBVar1;
  if (pBVar1 != (Branch *)0x0) {
    local_38 = (Branch *)params_2->size_;
  }
  local_30 = (char *)0x0;
  if (pBVar1 != (Branch *)0x0) {
    local_30 = (char *)((long)&pBVar1[-1].content.branches.disposer + 7);
  }
  local_48 = toCharSequence<char_const*&>((char **)params_3);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_58,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff98,(ArrayPtr<const_char> *)params_1,
             (StringTree *)&local_38,&local_48,params_4_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}